

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O0

void ym2612_generate(void *chip,FMSAMPLE *buffer,int frames,int mix)

{
  short local_40;
  short local_3e;
  int local_3c;
  FMSAMPLE bufTmp [2];
  int i;
  FMSAMPLE *bufOut;
  FM_CH *cch;
  YM2612 *F2612;
  int mix_local;
  int frames_local;
  FMSAMPLE *buffer_local;
  void *chip_local;
  
  _bufTmp = buffer;
  ym2612_pre_generate(chip);
  if (frames == 0) {
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4710));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x48b0));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4a50));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4bf0));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4d90));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4f30));
  }
  for (local_3c = 0; local_3c < frames; local_3c = local_3c + 1) {
    if (mix == 0) {
      ym2612_generate_one_native(chip,_bufTmp);
    }
    else {
      ym2612_generate_one_native(chip,&local_40);
      *_bufTmp = *_bufTmp + local_40;
      _bufTmp[1] = _bufTmp[1] + local_3e;
    }
    _bufTmp = _bufTmp + 2;
  }
  return;
}

Assistant:

void ym2612_generate(void *chip, FMSAMPLE *buffer, int frames, int mix)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_CH  *cch = F2612->CH;
	FMSAMPLE  *bufOut = buffer;
	int i;
#if !RSM_ENABLE
	FMSAMPLE bufTmp[2];
#endif

	ym2612_pre_generate(chip);

	if (!frames)
	{
		update_ssg_eg_channel(&cch[0].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5].SLOT[SLOT1]);
	}

	/* buffering */
	for(i=0 ; i < frames ; i++)
	{
#if RSM_ENABLE
		while(F2612->OPN.ST.framecnt >= F2612->OPN.ST.rateratio)/* Copy-Pasta from Nuked */
		{
			/* Copy-Pasta from Nuked */
			F2612->OPN.ST.prev_sample[0] = F2612->OPN.ST.cur_sample[0];
			F2612->OPN.ST.prev_sample[1] = F2612->OPN.ST.cur_sample[1];
			ym2612_generate_one_native(chip, F2612->OPN.ST.cur_sample);
			F2612->OPN.ST.framecnt -= F2612->OPN.ST.rateratio;
			/* Copy-Pasta from Nuked */
		}
		if (mix)
		{
			*bufOut++ += (FMSAMPLE)((F2612->OPN.ST.prev_sample[0] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[0] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
			*bufOut++ += (FMSAMPLE)((F2612->OPN.ST.prev_sample[1] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[1] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
		} else {
			*bufOut++ = (FMSAMPLE)((F2612->OPN.ST.prev_sample[0] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[0] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
			*bufOut++ = (FMSAMPLE)((F2612->OPN.ST.prev_sample[1] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[1] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
		}
		F2612->OPN.ST.framecnt += 1 << RSM_FRAC;
#else
		if (mix)
		{
			ym2612_generate_one_native(chip, bufTmp);
			bufOut[0] += bufTmp[0];
			bufOut[1] += bufTmp[1];
		}
		else
		{
			ym2612_generate_one_native(chip, bufOut);
		}
		bufOut += 2;
#endif
	}
	/* ym2612_post_generate(chip, frames); */
}